

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

string * anon_unknown.dwarf_484ce::get_word(string *__return_storage_ptr__,string *str_to_parse)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long *local_48 [2];
  long local_38 [2];
  
  uVar1 = str_to_parse->_M_string_length;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    pcVar2 = (str_to_parse->_M_dataplus)._M_p;
    uVar4 = 0;
    do {
      iVar3 = isspace((int)pcVar2[uVar4]);
      uVar5 = uVar4;
      if (iVar3 == 0) break;
      uVar4 = uVar4 + 1;
      uVar5 = uVar1;
    } while (uVar1 != uVar4);
  }
  if (uVar5 < uVar1) {
    pcVar2 = (str_to_parse->_M_dataplus)._M_p;
    do {
      iVar3 = isspace((int)pcVar2[uVar5]);
      if (iVar3 != 0) break;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str_to_parse);
  std::__cxx11::string::substr((ulong)local_48,(ulong)str_to_parse);
  std::__cxx11::string::operator=((string *)str_to_parse,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_word(std::string& str_to_parse) {
    size_t i = 0;
    for (; i < str_to_parse.size(); ++i) if (!std::isspace(str_to_parse[i])) break;
    for (; i < str_to_parse.size(); ++i) if (std::isspace(str_to_parse[i])) break;
    std::string word = str_to_parse.substr(0, i);
    str_to_parse = str_to_parse.substr(i);
    return word;
}